

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDStats.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMDRTheta::processFrame(RNEMDRTheta *this,int istep)

{
  SelectionManager *this_00;
  double *pdVar1;
  int *piVar2;
  double dVar3;
  double dVar4;
  pointer pOVar5;
  pointer pVVar6;
  __uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
  _Var7;
  double dVar8;
  double dVar9;
  uint i_8;
  uint uVar10;
  StuntDouble *pSVar11;
  pair<int,_int> pVar12;
  uint i_1;
  vector<double,_std::allocator<double>_> *pvVar13;
  double (*padVar14) [3];
  allocator_type *paVar15;
  long lVar16;
  undefined8 *puVar17;
  SelectionSet *pSVar18;
  long lVar19;
  long lVar20;
  uint j_1;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  double tmp_1;
  double tmp;
  int i;
  Mat3x3d I;
  Vector<double,_3U> result_4;
  Vector3<double> result;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  binL;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  binI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binCount;
  RectMatrix<double,_3U,_3U> result_3;
  pointer local_1b8 [3];
  int local_19c;
  SelectionSet local_198;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  double local_158;
  pointer local_148 [4];
  vector<double,_std::allocator<double>_> local_128;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  local_e0;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  local_c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b0;
  Vector3d local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar23 = 0;
  ShellStatistics::processFrame(&this->super_ShellStatistics,istep);
  if ((this->super_ShellStatistics).super_SpatialStatistics.evaluator_.isDynamic_ == true) {
    SelectionEvaluator::evaluate
              (&local_198,&(this->super_ShellStatistics).super_SpatialStatistics.evaluator_);
    lVar21 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_ShellStatistics).super_SpatialStatistics.seleMan_.ss_.
                           bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar21),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_198.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar21));
      lVar21 = lVar21 + 0x28;
    } while (lVar21 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_198.bitsets_);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b0,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_198);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::vector(&local_c8,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_198);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector(&local_e0,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_198);
  if ((this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_ != 0) {
    lVar21 = 0;
    uVar22 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&((local_b0.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(long)this->nAngleBins_);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      resize((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)((long)&((local_c8.
                          super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar21),(long)this->nAngleBins_
            );
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 ((long)&((local_e0.
                           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar21),
                 (long)this->nAngleBins_);
      uVar22 = uVar22 + 1;
      lVar21 = lVar21 + 0x18;
    } while (uVar22 < (this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.
                      nBins_);
  }
  this_00 = &(this->super_ShellStatistics).super_SpatialStatistics.seleMan_;
  pSVar11 = SelectionManager::beginSelected(this_00,&local_19c);
  while (pSVar11 != (StuntDouble *)0x0) {
    lVar21 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
    local_98.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar21 + 0x10 + (long)pSVar11->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar21 + (long)pSVar11->localIndex_ * 0x18);
    local_98.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_98.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pVar12 = getBins(this,&local_98);
    uVar10 = pVar12.first;
    if ((((-1 < (int)uVar10) && (-1 < (long)pVar12)) &&
        ((int)uVar10 <
         (int)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_)) &&
       (uVar22 = (ulong)pVar12 >> 0x20, pVar12.second < this->nAngleBins_)) {
      lVar21 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(lVar21 + 0x10 + (long)pSVar11->localIndex_ * 0x18);
      puVar17 = (undefined8 *)(lVar21 + (long)pSVar11->localIndex_ * 0x18);
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*puVar17;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)puVar17[1];
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar21 = 0;
      do {
        (&local_198.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar21] =
             (pointer)((double)(&local_128.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start)[lVar21] -
                      (this->super_ShellStatistics).coordinateOrigin_.super_Vector<double,_3U>.data_
                      [lVar21]);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      local_1b8[2] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b8[0] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_1b8[1] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      lVar21 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
      dVar3 = *(double *)(lVar21 + (long)pSVar11->localIndex_ * 0x18);
      dVar4 = pSVar11->mass_;
      pdVar1 = (double *)(lVar21 + 8 + (long)pSVar11->localIndex_ * 0x18);
      dVar8 = *pdVar1;
      dVar9 = pdVar1[1];
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar9 * (double)local_198.bitsets_.
                                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                          (double)local_198.bitsets_.
                                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage * dVar8);
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(dVar3 * (double)local_198.bitsets_.
                                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (double)local_198.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start * dVar9);
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((double)local_198.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start * dVar8 -
                    dVar3 * (double)local_198.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar21 = 0;
      do {
        (&local_198.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar21] =
             (pointer)((double)(&local_128.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start)[lVar21] * dVar4);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      local_148[2] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_148[0] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_148[1] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      local_158 = 0.0;
      local_168 = 0;
      uStack_160 = 0;
      local_178 = 0.0;
      uStack_170 = 0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_180 = 0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uStack_110 = 0;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pvVar13 = &local_128;
      lVar21 = 0;
      do {
        pOVar5 = local_1b8[lVar21];
        lVar20 = 0;
        do {
          (&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start)[lVar20] =
               (pointer)((double)local_1b8[lVar20] * (double)pOVar5);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar21 = lVar21 + 1;
        pvVar13 = pvVar13 + 1;
      } while (lVar21 != 3);
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_38 = 0;
      pvVar13 = &local_128;
      puVar17 = &local_78;
      lVar21 = 0;
      do {
        lVar20 = 0;
        do {
          puVar17[lVar20] =
               (double)(&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start)[lVar20] * dVar4;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar21 = lVar21 + 1;
        puVar17 = puVar17 + 3;
        pvVar13 = pvVar13 + 1;
      } while (lVar21 != 3);
      puVar17 = &local_78;
      pSVar18 = &local_198;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pSVar18->bitsets_).
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar17;
        puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
        pSVar18 = (SelectionSet *)((long)pSVar18 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      dVar3 = 0.0;
      lVar21 = 0;
      do {
        dVar3 = dVar3 + (double)local_1b8[lVar21] * (double)local_1b8[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      dVar4 = dVar4 * dVar3;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((double)local_198.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start + dVar4);
      local_178 = local_178 + dVar4;
      local_158 = dVar4 + local_158;
      uVar10 = uVar10 & 0x7fffffff;
      padVar14 = (double (*) [3])
                 (local_c8.
                  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                  super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar22);
      pSVar18 = &local_198;
      lVar21 = 0;
      do {
        lVar20 = 0;
        do {
          *(double *)
           ((long)(((SquareMatrix<double,_3> *)*padVar14)->super_RectMatrix<double,_3U,_3U>).data_ +
           lVar20 * 8) = (double)(&(pSVar18->bitsets_).
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)[lVar20] +
                         *(double *)
                          ((long)(((SquareMatrix<double,_3> *)*padVar14)->
                                 super_RectMatrix<double,_3U,_3U>).data_ + lVar20 * 8);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar21 = lVar21 + 1;
        padVar14 = padVar14 + 1;
        pSVar18 = pSVar18 + 1;
      } while (lVar21 != 3);
      pVVar6 = local_e0.
               super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = 0;
      do {
        pVVar6[uVar22].super_Vector<double,_3U>.data_[lVar21] =
             (double)local_148[lVar21] + pVVar6[uVar22].super_Vector<double,_3U>.data_[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      piVar2 = local_b0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + uVar22;
      *piVar2 = *piVar2 + 1;
    }
    pSVar11 = SelectionManager::nextSelected(this_00,&local_19c);
  }
  if ((this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_ != 0) {
    uVar22 = 0;
    do {
      (**(code **)(*(long *)(this->r_).accumulator.
                            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                            super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                            ._M_t + 0x10))
                (SUB84(((double)(uVar22 & 0xffffffff) + 0.5) *
                       (this->super_ShellStatistics).binWidth_,0));
      std::vector<double,_std::allocator<double>_>::vector
                (&local_128,(long)this->nAngleBins_,(allocator_type *)&local_198);
      if (0 < this->nAngleBins_) {
        lVar21 = 0;
        lVar20 = 0;
        do {
          local_1b8[0] = (pointer)0x0;
          local_1b8[1] = (pointer)0x0;
          local_1b8[2] = (pointer)0x0;
          if (0 < local_b0.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar22].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar20]) {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)&local_198,
                       local_c8.
                       super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20);
            pVVar6 = local_e0.
                     super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar22].
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_148[0] = (pointer)0x0;
            local_148[1] = (pointer)0x0;
            local_148[2] = (pointer)0x0;
            lVar16 = 0;
            paVar15 = (allocator_type *)&local_198;
            do {
              pOVar5 = local_148[lVar16];
              lVar19 = 0;
              do {
                pOVar5 = (pointer)((double)pOVar5 +
                                  *(double *)(paVar15 + lVar19 * 8) *
                                  *(double *)
                                   ((long)(pVVar6->super_Vector<double,_3U>).data_ +
                                   lVar19 * 8 + lVar21));
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_148[lVar16] = pOVar5;
              lVar16 = lVar16 + 1;
              paVar15 = paVar15 + 0x18;
            } while (lVar16 != 3);
            local_1b8[2] = local_148[2];
            local_1b8[0] = local_148[0];
            local_1b8[1] = local_148[1];
          }
          dVar3 = 0.0;
          lVar16 = 0;
          do {
            dVar3 = dVar3 + (double)local_1b8[lVar16] *
                            (this->fluxVector_).super_Vector<double,_3U>.data_[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar20] = dVar3;
          lVar20 = lVar20 + 1;
          lVar21 = lVar21 + 0x18;
        } while (lVar20 < this->nAngleBins_);
      }
      _Var7._M_t.
      super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
      .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
           (this->angularVelocity_).accumulator.
           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
           super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
           ._M_t;
      (**(code **)(*(long *)_Var7._M_t.
                            super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                            .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                            _M_head_impl + 0x18))
                (_Var7._M_t.
                 super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                 .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
                 &local_128);
      if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.
                      nBins_);
  }
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::~vector(&local_e0);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b0);
  return;
}

Assistant:

void RNEMDRTheta::processFrame(int istep) {
    ShellStatistics::processFrame(istep);

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    StuntDouble* sd;
    int i;

    std::vector<std::vector<int>> binCount(nBins_);
    std::vector<std::vector<Mat3x3d>> binI(nBins_);
    std::vector<std::vector<Vector3d>> binL(nBins_);

    for (std::size_t i {}; i < nBins_; ++i) {
      binCount[i].resize(nAngleBins_);
      binI[i].resize(nAngleBins_);
      binL[i].resize(nAngleBins_);
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      std::pair<int, int> bins = getBins(sd->getPos());

      if (bins.first >= 0 && bins.first < int(nBins_)) {
        if (bins.second >= 0 && bins.second < nAngleBins_) {
          Vector3d rPos = sd->getPos() - coordinateOrigin_;
          Vector3d vel  = sd->getVel();
          RealType m    = sd->getMass();
          Vector3d L    = m * cross(rPos, vel);
          Mat3x3d I(0.0);
          I           = outProduct(rPos, rPos) * m;
          RealType r2 = rPos.lengthSquare();
          I(0, 0) += m * r2;
          I(1, 1) += m * r2;
          I(2, 2) += m * r2;

          binI[bins.first][bins.second] += I;
          binL[bins.first][bins.second] += L;
          binCount[bins.first][bins.second]++;
        }
      }
    }

    for (unsigned int i = 0; i < nBins_; i++) {
      RealType r = (((RealType)i + 0.5) * binWidth_);
      r_.accumulator[i]->add(r);

      std::vector<RealType> projections(nAngleBins_);

      for (int j = 0; j < nAngleBins_; j++) {
        Vector3d omega(0.0);

        if (binCount[i][j] > 0) { omega = binI[i][j].inverse() * binL[i][j]; }

        // RealType omegaProj = dot(omega, fluxVector_);
        projections[j] = dot(omega, fluxVector_);
      }

      angularVelocity_.accumulator[i]->add(projections);
    }
  }